

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# iraffits.c
# Opt level: O0

int fits_delete_iraf_file(char *filename,int *status)

{
  char *__ptr;
  int *in_RSI;
  char *in_RDI;
  char pixfilename [256];
  int lenirafhead;
  char *irafheader;
  char acStackY_128 [24];
  int *in_stack_fffffffffffffef0;
  char *in_stack_fffffffffffffef8;
  char *in_stack_ffffffffffffff00;
  char *in_stack_ffffffffffffff08;
  int *in_stack_ffffffffffffff50;
  char *in_stack_ffffffffffffff58;
  int local_4;
  
  __ptr = irafrdhead(in_stack_ffffffffffffff58,in_stack_ffffffffffffff50);
  if (__ptr == (char *)0x0) {
    *in_RSI = 0x68;
    local_4 = 0x68;
  }
  else {
    getirafpixname(in_stack_ffffffffffffff08,in_stack_ffffffffffffff00,in_stack_fffffffffffffef8,
                   in_stack_fffffffffffffef0);
    free(__ptr);
    if (*in_RSI < 1) {
      remove(in_RDI);
      remove(acStackY_128);
      local_4 = *in_RSI;
    }
    else {
      local_4 = *in_RSI;
    }
  }
  return local_4;
}

Assistant:

int fits_delete_iraf_file(const char *filename,  /* name of input file      */
             int *status)                        /* IO - error status       */

/*
   Delete the iraf .imh header file and the associated .pix data file
*/
{
    char *irafheader;
    int lenirafhead;

    char pixfilename[SZ_IM2PIXFILE+1];

    /* read IRAF header into dynamically created char array (free it later!) */
    irafheader = irafrdhead(filename, &lenirafhead);

    if (!irafheader)
    {
	return(*status = FILE_NOT_OPENED);
    }

    getirafpixname (filename, irafheader, pixfilename, status);

    /* don't need the IRAF header any more */
    free(irafheader);

    if (*status > 0)
       return(*status);

    remove(filename);
    remove(pixfilename);
    
    return(*status);
}